

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_ext.cpp
# Opt level: O0

iterator * cs_impl::array_cs_ext::erase(array *arr,iterator *pos)

{
  _Deque_iterator<cs_impl::any,_cs_impl::any_&,_cs_impl::any_*> *in_RDX;
  iterator *in_RDI;
  _Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*> local_38 [24];
  const_iterator *in_stack_ffffffffffffffe0;
  
  std::_Deque_iterator<cs_impl::any,cs_impl::any_const&,cs_impl::any_const*>::
  _Deque_iterator<std::_Deque_iterator<cs_impl::any,cs_impl::any&,cs_impl::any*>,void>
            (local_38,in_RDX);
  std::deque<cs_impl::any,_std::allocator<cs_impl::any>_>::erase
            ((deque<cs_impl::any,_std::allocator<cs_impl::any>_> *)in_RDX,in_stack_ffffffffffffffe0)
  ;
  return in_RDI;
}

Assistant:

array::iterator erase(array &arr, array::iterator &pos)
		{
			return arr.erase(pos);
		}